

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O3

void __thiscall
flatbuffers::BinaryAnnotator::BinaryAnnotator
          (BinaryAnnotator *this,uint8_t *bfbs,uint64_t bfbs_length,uint8_t *binary,
          uint64_t binary_length,bool is_size_prefixed)

{
  _Rb_tree_header *p_Var1;
  Schema *pSVar2;
  
  this->bfbs_ = bfbs;
  this->bfbs_length_ = bfbs_length;
  if (bfbs == (uint8_t *)0x0) {
    pSVar2 = (Schema *)0x0;
  }
  else {
    pSVar2 = (Schema *)(bfbs + *(uint *)bfbs);
  }
  this->schema_ = pSVar2;
  (this->root_table_)._M_dataplus._M_p = (pointer)&(this->root_table_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->root_table_,"");
  this->binary_ = binary;
  this->binary_length_ = binary_length;
  this->is_size_prefixed_ = is_size_prefixed;
  p_Var1 = &(this->vtables_)._M_t._M_impl.super__Rb_tree_header;
  (this->vtables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vtables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vtables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vtables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vtables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->sections_)._M_t._M_impl.super__Rb_tree_header;
  (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

explicit BinaryAnnotator(const uint8_t *const bfbs,
                           const uint64_t bfbs_length,
                           const uint8_t *const binary,
                           const uint64_t binary_length,
                           const bool is_size_prefixed)
      : bfbs_(bfbs),
        bfbs_length_(bfbs_length),
        schema_(reflection::GetSchema(bfbs)),
        root_table_(""),
        binary_(binary),
        binary_length_(binary_length),
        is_size_prefixed_(is_size_prefixed) {}